

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrueTypePrimitiveWriter.cpp
# Opt level: O1

EStatusCode __thiscall
TrueTypePrimitiveWriter::WriteBYTE(TrueTypePrimitiveWriter *this,Byte inValue)

{
  int iVar1;
  EStatusCode EVar2;
  undefined4 extraout_var;
  Byte local_9;
  
  if (this->mInternalState == eFailure) {
    EVar2 = eFailure;
  }
  else {
    local_9 = inValue;
    iVar1 = (*(this->mTrueTypeFile->super_IByteWriterWithPosition).super_IByteWriter.
              _vptr_IByteWriter[2])(this->mTrueTypeFile,&local_9,1);
    EVar2 = -(uint)(CONCAT44(extraout_var,iVar1) != 1);
    if (CONCAT44(extraout_var,iVar1) != 1) {
      this->mInternalState = eFailure;
    }
  }
  return EVar2;
}

Assistant:

EStatusCode TrueTypePrimitiveWriter::WriteBYTE(Byte inValue)
{
	if(PDFHummus::eFailure == mInternalState)
		return PDFHummus::eFailure;

	EStatusCode status = (mTrueTypeFile->Write(&inValue,1) == 1 ? PDFHummus::eSuccess : PDFHummus::eFailure);

	if(PDFHummus::eFailure == status)
		mInternalState = PDFHummus::eFailure;
	return status;	
}